

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Regex.cpp
# Opt level: O2

bool __thiscall Regex::processSubTree(Regex *this,Element *cur_node,ParseData *data)

{
  Element *pEVar1;
  bool bVar2;
  Element *cur_node_00;
  
  pEVar1 = cur_node;
  while ((cur_node_00 = pEVar1, cur_node_00 != (Element *)0x0 &&
         (bVar2 = processElement(this,cur_node_00,data), bVar2))) {
    if (((cur_node_00->mType == TYPE_OR) ||
        ((cur_node_00->mType == TYPE_CLASS ||
         (pEVar1 = cur_node_00->mChild, cur_node_00->mChild == (Element *)0x0)))) &&
       (pEVar1 = cur_node_00->mNext, cur_node_00->mNext == (Element *)0x0)) {
      bVar2 = false;
      while (pEVar1 = cur_node_00, !bVar2) {
        pEVar1 = cur_node_00->mParent;
        bVar2 = true;
        cur_node_00 = (Element *)0x0;
        if (pEVar1 != cur_node) {
          bVar2 = pEVar1->mNext != (Element *)0x0;
          cur_node_00 = pEVar1;
          if (bVar2) {
            cur_node_00 = pEVar1->mNext;
          }
        }
      }
    }
  }
  return cur_node_00 == (Element *)0x0;
}

Assistant:

bool	Regex::processSubTree( Element *cur_node, ParseData *data )
{
	Element *top_node = cur_node;
	
	while( cur_node != NULL )
	{
		if ( processElement( cur_node, data ) == false )
			return false;
		
		if ( cur_node->mType != TYPE_CLASS && cur_node->mType != TYPE_OR && cur_node->mChild != NULL )
		{
			cur_node = cur_node->mChild;
		}
		else if ( cur_node->mNext != NULL )
		{
			cur_node = cur_node->mNext;
		}
		else 
		{
			bool done = false;
			while ( !done )
			{
				if ( top_node == cur_node->mParent )
				{
					done = true;
					cur_node = NULL;
				}
				else
				{
					cur_node = cur_node->mParent;
					if ( cur_node->mNext != NULL )
					{
						cur_node = cur_node->mNext;
						done = true;
					}
				}
			}
		}
	}
	
	return true;
}